

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandWriteCnf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  uint local_48;
  uint local_44;
  int fVerbose;
  int fChangePol;
  int fAllPrimes;
  int fFastAlgo;
  int fNewAlgo;
  int c;
  char *pFileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar3 = true;
  bVar2 = false;
  bVar1 = false;
  local_44 = 1;
  local_48 = 0;
  Extra_UtilGetoptReset();
  while (iVar4 = Extra_UtilGetopt(argc,argv,"nfpcvh"), iVar4 != -1) {
    switch(iVar4) {
    case 99:
      local_44 = local_44 ^ 1;
      break;
    default:
      goto LAB_0033b0d6;
    case 0x66:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 0x68:
      goto LAB_0033b0d6;
    case 0x6e:
      bVar3 = (bool)(bVar3 ^ 1);
      break;
    case 0x70:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x76:
      local_48 = local_48 ^ 1;
    }
  }
  if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
    fprintf((FILE *)pAbc->Out,"Empty network.\n");
    pAbc_local._4_4_ = 0;
  }
  else if (argc == globalUtilOptind + 1) {
    pcVar5 = argv[globalUtilOptind];
    iVar4 = Abc_NtkIsStrash(pAbc->pNtkCur);
    if ((iVar4 != 0) && (bVar1)) {
      bVar1 = false;
      printf(
            "Warning: Selected option to write all primes has no effect when deriving CNF from AIG.\n"
            );
    }
    if (bVar2) {
      Abc_NtkDarToCnf(pAbc->pNtkCur,pcVar5,1,local_44,local_48);
    }
    else if (bVar3) {
      Abc_NtkDarToCnf(pAbc->pNtkCur,pcVar5,0,local_44,local_48);
    }
    else if (bVar1) {
      Io_WriteCnf(pAbc->pNtkCur,pcVar5,1);
    }
    else {
      Io_Write(pAbc->pNtkCur,pcVar5,IO_FILE_CNF);
    }
    pAbc_local._4_4_ = 0;
  }
  else {
LAB_0033b0d6:
    fprintf((FILE *)pAbc->Err,"usage: write_cnf [-nfpcvh] <file>\n");
    fprintf((FILE *)pAbc->Err,"\t         generates CNF for the miter (see also \"&write_cnf\")\n");
    pcVar5 = "no";
    if (bVar3) {
      pcVar5 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-n     : toggle using new algorithm [default = %s]\n",pcVar5);
    pcVar5 = "no";
    if (bVar2) {
      pcVar5 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-f     : toggle using fast algorithm [default = %s]\n",pcVar5);
    pcVar5 = "no";
    if (bVar1) {
      pcVar5 = "yes";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-p     : toggle using all primes to enhance implicativity [default = %s]\n",pcVar5);
    pcVar5 = "no";
    if (local_44 != 0) {
      pcVar5 = "yes";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-c     : toggle adjasting polarity of internal variables [default = %s]\n",pcVar5);
    pcVar5 = "no";
    if (local_48 != 0) {
      pcVar5 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-v     : toggle printing verbose information [default = %s]\n",
            pcVar5);
    fprintf((FILE *)pAbc->Err,"\t-h     : print the help massage\n");
    fprintf((FILE *)pAbc->Err,"\tfile   : the name of the file to write\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandWriteCnf( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pFileName;
    int c;
    int fNewAlgo;
    int fFastAlgo;
    int fAllPrimes;
    int fChangePol;
    int fVerbose;
    extern Abc_Ntk_t * Abc_NtkDarToCnf( Abc_Ntk_t * pNtk, char * pFileName, int fFastAlgo, int fChangePol, int fVerbose );

    fNewAlgo = 1;
    fFastAlgo = 0;
    fAllPrimes = 0;
    fChangePol = 1;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "nfpcvh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'n':
                fNewAlgo ^= 1;
                break;
            case 'f':
                fFastAlgo ^= 1;
                break;
            case 'p':
                fAllPrimes ^= 1;
                break;
            case 'c':
                fChangePol ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // check if the feature will be used
    if ( Abc_NtkIsStrash(pAbc->pNtkCur) && fAllPrimes )
    {
        fAllPrimes = 0;
        printf( "Warning: Selected option to write all primes has no effect when deriving CNF from AIG.\n" );
    }
    // call the corresponding file writer
    if ( fFastAlgo )
        Abc_NtkDarToCnf( pAbc->pNtkCur, pFileName, 1, fChangePol, fVerbose );
    else if ( fNewAlgo )
        Abc_NtkDarToCnf( pAbc->pNtkCur, pFileName, 0, fChangePol, fVerbose );
    else if ( fAllPrimes )
        Io_WriteCnf( pAbc->pNtkCur, pFileName, 1 );
    else
        Io_Write( pAbc->pNtkCur, pFileName, IO_FILE_CNF );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_cnf [-nfpcvh] <file>\n" );
    fprintf( pAbc->Err, "\t         generates CNF for the miter (see also \"&write_cnf\")\n" );
    fprintf( pAbc->Err, "\t-n     : toggle using new algorithm [default = %s]\n", fNewAlgo? "yes" : "no" );
    fprintf( pAbc->Err, "\t-f     : toggle using fast algorithm [default = %s]\n", fFastAlgo? "yes" : "no" );
    fprintf( pAbc->Err, "\t-p     : toggle using all primes to enhance implicativity [default = %s]\n", fAllPrimes? "yes" : "no" );
    fprintf( pAbc->Err, "\t-c     : toggle adjasting polarity of internal variables [default = %s]\n", fChangePol? "yes" : "no" );
    fprintf( pAbc->Err, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes" : "no" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}